

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::BaseCompiler::setStackSize
          (BaseCompiler *this,uint32_t virtId,uint32_t newSize,uint32_t newAlignment)

{
  long lVar1;
  Error EVar2;
  VirtReg *pVVar3;
  uint in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  RAWorkReg *workReg;
  VirtReg *vReg;
  uint32_t in_stack_ffffffffffffff9c;
  undefined7 in_stack_ffffffffffffffa0;
  byte in_stack_ffffffffffffffa7;
  BaseEmitter *in_stack_ffffffffffffffb0;
  uint local_3c;
  Error local_28;
  
  if (in_ESI - 0x100U < *(uint *)(in_RDI + 0x1f0)) {
    if (in_ECX != 0) {
      in_stack_ffffffffffffffa7 = 0;
      if (in_ECX != 0) {
        in_stack_ffffffffffffffa7 = (in_ECX & in_ECX - 1) != 0 ^ 0xff;
      }
      if ((in_stack_ffffffffffffffa7 & 1) == 0) {
        DebugUtils::errored(2);
        EVar2 = BaseEmitter::reportError
                          (in_stack_ffffffffffffffb0,(Error)((ulong)in_RDI >> 0x20),
                           (char *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
        return EVar2;
      }
    }
    local_3c = in_ECX;
    if (0x40 < in_ECX) {
      local_3c = 0x40;
    }
    pVVar3 = virtRegById((BaseCompiler *)
                         CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff9c);
    if (in_EDX != 0) {
      *(int *)(pVVar3 + 8) = in_EDX;
    }
    if (local_3c != 0) {
      pVVar3[0xc] = SUB41(local_3c,0);
    }
    lVar1 = *(long *)(pVVar3 + 0x28);
    if ((lVar1 != 0) && (*(long *)(lVar1 + 0x18) != 0)) {
      *(undefined4 *)(*(long *)(lVar1 + 0x18) + 4) = *(undefined4 *)(pVVar3 + 8);
      *(VirtReg *)(*(long *)(lVar1 + 0x18) + 1) = pVVar3[0xc];
    }
    local_28 = 0;
  }
  else {
    local_28 = DebugUtils::errored(0x1e);
  }
  return local_28;
}

Assistant:

Error BaseCompiler::setStackSize(uint32_t virtId, uint32_t newSize, uint32_t newAlignment) {
  if (!isVirtIdValid(virtId))
    return DebugUtils::errored(kErrorInvalidVirtId);

  if (newAlignment && !Support::isPowerOf2(newAlignment))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  if (newAlignment > 64)
    newAlignment = 64;

  VirtReg* vReg = virtRegById(virtId);
  if (newSize)
    vReg->_virtSize = newSize;

  if (newAlignment)
    vReg->_alignment = uint8_t(newAlignment);

  // This is required if the RAPass is already running. There is a chance that a stack-slot has been already
  // allocated and in that case it has to be updated as well, otherwise we would allocate wrong amount of memory.
  RAWorkReg* workReg = vReg->_workReg;
  if (workReg && workReg->_stackSlot) {
    workReg->_stackSlot->_size = vReg->_virtSize;
    workReg->_stackSlot->_alignment = vReg->_alignment;
  }

  return kErrorOk;
}